

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamReaderPrivate::putReplacementInAttributeValue(QXmlStreamReaderPrivate *this,QStringView s)

{
  ushort uVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  QXmlStreamSimpleStack<unsigned_int>::reserve(&this->putStack,s.m_size);
  puVar2 = (this->putStack).data;
  lVar3 = (this->putStack).tos;
  lVar6 = s.m_size * 2;
  do {
    lVar3 = lVar3 + 1;
    if (lVar6 == 0) {
      return;
    }
    uVar1 = *(ushort *)((long)s.m_data + lVar6 + -2);
    if (uVar1 == 10) {
LAB_003536a4:
      uVar5 = 0x20;
    }
    else {
      uVar5 = (uint)uVar1;
      if ((uVar1 != 0x3b) && (uVar4 = (uint)uVar1, uVar5 = (uint)uVar1, uVar4 != 0x26)) {
        if (uVar4 == 0xd) goto LAB_003536a4;
        uVar5 = uVar4 | 0x1a0000;
      }
    }
    (this->putStack).tos = lVar3;
    puVar2[lVar3] = uVar5;
    lVar6 = lVar6 + -2;
  } while( true );
}

Assistant:

void QXmlStreamReaderPrivate::putReplacementInAttributeValue(QStringView s)
{
    putStack.reserve(s.size());
    for (auto it = s.rbegin(), end = s.rend(); it != end; ++it) {
        char16_t c = it->unicode();
        if (c == '&' || c == ';')
            putStack.rawPush() = c;
        else if (c == '\n' || c == '\r')
            putStack.rawPush() = ' ';
        else
            putStack.rawPush() = ((LETTER << 16) | c);
    }
}